

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O2

char * choc::text::FloatToStringBuffer<float>::addDecimalPointAndExponent
                 (char *pos,uint32_t totalLength,int K,int maxDecimalPlaces)

{
  uint32_t mantissaLength;
  char *pcVar1;
  
  mantissaLength = K + totalLength;
  if (SBORROW4(mantissaLength,-maxDecimalPlaces) != (int)(mantissaLength + maxDecimalPlaces) < 0) {
    pos[0] = '0';
    pos[1] = '.';
    pos[2] = '0';
    return pos + 3;
  }
  if (mantissaLength + 5 < 6) {
    pcVar1 = writeWithoutExponentLessThan1(pos,totalLength,mantissaLength,maxDecimalPlaces);
    return pcVar1;
  }
  if (mantissaLength - 1 < 0x15) {
    pcVar1 = writeWithoutExponentGreaterThan1(pos,totalLength,mantissaLength,maxDecimalPlaces,K);
    return pcVar1;
  }
  pcVar1 = writeAsExponentNotation(pos,totalLength,mantissaLength - 1);
  return pcVar1;
}

Assistant:

static const char* addDecimalPointAndExponent (char* pos, uint32_t totalLength, int K, int maxDecimalPlaces)
    {
        auto mantissaDigits = static_cast<int> (totalLength) + K;

        if (mantissaDigits < -maxDecimalPlaces)          return writeZero (pos);
        if (mantissaDigits <= 0 && mantissaDigits > -6)  return writeWithoutExponentLessThan1 (pos, totalLength, mantissaDigits, maxDecimalPlaces);
        if (mantissaDigits > 0 && mantissaDigits <= 21)  return writeWithoutExponentGreaterThan1 (pos, totalLength, static_cast<uint32_t> (mantissaDigits), maxDecimalPlaces, K);

        return writeAsExponentNotation (pos, totalLength, mantissaDigits - 1);
    }